

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

TString * __thiscall CFile::ReadWord(CFile *this)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  uint uVar5;
  FILE *__stream;
  long lVar6;
  uchar tempbuf [2048];
  
  __stream = (FILE *)this->fp;
  if (__stream == (FILE *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "ReadWord error: Invalid fp.";
  }
  else {
    if (this->endoffile != true) {
      while( true ) {
        uVar1 = fgetc(__stream);
        iVar2 = isspace(uVar1 & 0xff);
        if (iVar2 == 0) break;
        __stream = (FILE *)this->fp;
      }
      if (((uchar)uVar1 == '\'') || ((uVar1 & 0xff) == 0x22)) {
        uVar5 = uVar1 & 0x27;
        lVar6 = 0;
      }
      else {
        lVar6 = 1;
        uVar5 = 0x20;
        tempbuf[0] = (uchar)uVar1;
      }
      do {
        if (lVar6 == 0x800) {
          UpdateEOF(this);
          if (this->endoffile == false) {
            fprintf(_stderr,"Bug: word too long: %s",tempbuf);
          }
LAB_002820ed:
          return &this->result;
        }
        uVar1 = fgetc((FILE *)this->fp);
        tempbuf[lVar6] = (uchar)uVar1;
        uVar1 = uVar1 & 0xff;
        if (uVar5 == 0x20) {
          iVar2 = isspace(uVar1);
          if (iVar2 != 0) {
            ungetc(uVar1,(FILE *)this->fp);
LAB_002820c6:
            tempbuf[lVar6] = '\0';
            pcVar4 = TString::GetBuffer(&this->result);
            strcpy(pcVar4,(char *)tempbuf);
            UpdateEOF(this);
            goto LAB_002820ed;
          }
        }
        else if (uVar1 == uVar5) goto LAB_002820c6;
        lVar6 = lVar6 + 1;
      } while( true );
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "ReadWord error: EOF.";
  }
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

ReadWord(void)
{
	if(!fp)
		throw "ReadWord error: Invalid fp.";
	
	if(End())
		throw "ReadWord error: EOF.";
	
	unsigned char cEnd, tempbuf[MAX_WORD_LENGTH], *pbuf;
	for(cEnd = fgetc(fp); isspace(cEnd); cEnd = fgetc(fp))
		;
	if(cEnd == '\'' || cEnd == '"')
		pbuf = &tempbuf[0];
	else
	{
		tempbuf[0] = cEnd;
		pbuf = &tempbuf[0] + 1;
		cEnd = ' ';
	}

	for(; pbuf < tempbuf + MAX_WORD_LENGTH; pbuf++)
	{
		*pbuf = fgetc(fp);

		if(cEnd == ' ' ? isspace(*pbuf) : *pbuf == cEnd) 	//if the endchar is a  ' ' we're looking for whitespace
		{													//otherwise just a match to cEnd
			if(cEnd == ' ')
				ungetc(*pbuf, fp);							//back up!

			*pbuf = '\0';
			strcpy(result.GetBuffer(), (const char *)&tempbuf[0]);
			UpdateEOF();
			return result;
		}
	}
	UpdateEOF();
	if(!End())
		fprintf(stderr, "Bug: word too long: %s", tempbuf);
	return result;
}